

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O0

filepos_t EBML_ElementFullSize(ebml_element *Element,bool_t bWithDefault)

{
  uint8_t SizeLength;
  filepos_t Length;
  byte bVar1;
  long lVar2;
  size_t sVar3;
  bool_t bSizeIsFinite;
  bool_t bWithDefault_local;
  ebml_element *Element_local;
  
  if (bWithDefault == 0) {
    if (Element == (ebml_element *)0x0) {
      __assert_fail("(const void*)(Element)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                    ,0x7a,"filepos_t EBML_ElementFullSize(const ebml_element *, bool_t)");
    }
    lVar2 = (**(code **)((long)(Element->Base).Base.VMT + 0x88))(Element);
    if (lVar2 != 0) {
      return -1;
    }
  }
  lVar2 = Element->DataSize;
  sVar3 = GetIdLength(Element->Context->Id);
  Length = Element->DataSize;
  SizeLength = Element->SizeLength;
  bSizeIsFinite = EBML_ElementIsFiniteSize(Element);
  bVar1 = EBML_CodedSizeLength(Length,SizeLength,bSizeIsFinite);
  return lVar2 + sVar3 + (ulong)bVar1;
}

Assistant:

filepos_t EBML_ElementFullSize(const ebml_element *Element, bool_t bWithDefault)
{
    if (!bWithDefault && EBML_ElementIsDefaultValue(Element))
        return INVALID_FILEPOS_T; // won't be saved
    return Element->DataSize + GetIdLength(Element->Context->Id) + EBML_CodedSizeLength(Element->DataSize, Element->SizeLength, EBML_ElementIsFiniteSize(Element));
}